

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

float __thiscall Assimp::AMFImporter::XML_ReadNode_GetVal_AsFloat(AMFImporter *this)

{
  uint uVar1;
  int iVar2;
  DeadlyImportError *pDVar3;
  undefined4 extraout_var;
  char *c;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  float local_34;
  undefined1 local_30 [4];
  float tvalf;
  string val;
  AMFImporter *this_local;
  
  val.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((uVar1 & 1) == 0) {
    local_6a = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"XML_ReadNode_GetVal_AsFloat. No data, seems file is corrupt.",
               &local_69);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_68);
    local_6a = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar2 != 3) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "XML_ReadNode_GetVal_AsFloat. Invalid type of XML element, seems file is corrupt.",
               &local_91);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_90);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
  ParseHelper_FixTruncatedFloatString(this,(char *)CONCAT44(extraout_var,iVar2),(string *)local_30);
  c = (char *)std::__cxx11::string::c_str();
  fast_atoreal_move<float>(c,&local_34,false);
  std::__cxx11::string::~string((string *)local_30);
  return local_34;
}

Assistant:

float AMFImporter::XML_ReadNode_GetVal_AsFloat()
{
    std::string val;
    float tvalf;

	if(!mReader->read()) throw DeadlyImportError("XML_ReadNode_GetVal_AsFloat. No data, seems file is corrupt.");
	if(mReader->getNodeType() != irr::io::EXN_TEXT) throw DeadlyImportError("XML_ReadNode_GetVal_AsFloat. Invalid type of XML element, seems file is corrupt.");

	ParseHelper_FixTruncatedFloatString(mReader->getNodeData(), val);
	fast_atoreal_move(val.c_str(), tvalf, false);

	return tvalf;
}